

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_ways.cxx
# Opt level: O2

void __thiscall xray_re::xr_way_object::save_v12(xr_way_object *this,xr_ini_writer *w)

{
  _Rb_tree_header *p_Var1;
  pointer pwVar2;
  int iVar3;
  iterator iVar4;
  byte bVar5;
  size_t in_RCX;
  void *__buf;
  ulong uVar6;
  way_link *link;
  pointer __k;
  pair<unsigned_short,_unsigned_char> local_f4;
  xr_way_object *local_f0;
  dict indices;
  char buffer [128];
  
  xr_custom_object::save_v12(&this->super_xr_custom_object,w);
  p_Var1 = &indices._M_t._M_impl.super__Rb_tree_header;
  indices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pwVar2 = (this->m_links).super__Vector_base<xray_re::way_link,_std::allocator<xray_re::way_link>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __k = (this->m_links).super__Vector_base<xray_re::way_link,_std::allocator<xray_re::way_link>_>.
        _M_impl.super__Vector_impl_data._M_start;
  local_f0 = this;
  indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  indices._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  for (; __k != pwVar2; __k = __k + 1) {
    iVar4 = std::
            _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_unsigned_char>,_std::_Select1st<std::pair<const_unsigned_short,_unsigned_char>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
            ::find((_Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_unsigned_char>,_std::_Select1st<std::pair<const_unsigned_short,_unsigned_char>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
                    *)&indices,&__k->from);
    if ((_Rb_tree_header *)iVar4._M_node == p_Var1) {
      local_f4.first = __k->from;
      local_f4.second = '\0';
      std::
      _Rb_tree<unsigned_short,std::pair<unsigned_short_const,unsigned_char>,std::_Select1st<std::pair<unsigned_short_const,unsigned_char>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_char>>>
      ::_M_emplace_unique<std::pair<unsigned_short,unsigned_char>>
                ((_Rb_tree<unsigned_short,std::pair<unsigned_short_const,unsigned_char>,std::_Select1st<std::pair<unsigned_short_const,unsigned_char>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_char>>>
                  *)&indices,&local_f4);
      uVar6 = 0;
    }
    else {
      bVar5 = *(byte *)((long)&iVar4._M_node[1]._M_color + 2) + 1;
      *(byte *)((long)&iVar4._M_node[1]._M_color + 2) = bVar5;
      uVar6 = (ulong)bVar5;
    }
    in_RCX = (size_t)__k->from;
    iVar3 = snprintf(buffer,0x80,"link_wp_%d_%d",in_RCX,uVar6);
    if (0 < iVar3) {
      xr_ini_writer::write(w,(int)buffer,__buf,in_RCX);
    }
  }
  xr_ini_writer::write(w,0x1d296f,(void *)(ulong)local_f0->m_type,in_RCX);
  xr_ini_writer::write(w,0x1d3f45,(void *)0x13,in_RCX);
  xr_ini_writer::
  w_ini_seq<std::vector<xray_re::way_point_le,std::allocator<xray_re::way_point_le>>,write_point_ini>
            (w,&local_f0->m_points);
  xr_ini_writer::write
            (w,0x1d3125,
             (void *)(((long)(local_f0->m_points).
                             super__Vector_base<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_f0->m_points).
                            super__Vector_base<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x38),0x38);
  std::
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_unsigned_char>,_std::_Select1st<std::pair<const_unsigned_short,_unsigned_char>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
  ::~_Rb_tree(&indices._M_t);
  return;
}

Assistant:

void xr_way_object::save_v12(xr_ini_writer* w) const
{
	xr_custom_object::save_v12(w);

	// write links
	char buffer[128];
	char* buf = &buffer[0];
	typedef std::map<uint16_t, uint8_t> dict;
	typedef std::pair<uint16_t, uint8_t> dict_pair;
	dict indices;
	fvector2 link_vector;
	link_vector.y = 1.0;

	way_link_vec_cit it = m_links.begin(), end = m_links.end();
	for (uint8_t id = 0; it != end; ++it) {
		way_link* link = (way_link *)&(*it);

		dict::iterator pair = indices.find(link->from);
		if (pair != indices.end())
			id = ++pair->second;
		else
			indices.insert(dict_pair(link->from, id = 0));

		int n = xr_snprintf(buf, sizeof(buffer), "link_wp_%d_%d", link->from, id);
		if (n > 0)
		{
			link_vector.x = link->to;
			link_vector.y = link->weight;
			w->write(buf, link_vector);
		}
	}

	w->write("type", this->m_type);
	w->write("version", WAYOBJECT_VERSION);

	// write waypoints

	w->w_ini_seq(this->m_points, write_point_ini());
	w->write("wp_count", this->m_points.size());
}